

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcEdgeLogLikelihoodsFirstDeriv
          (BeagleCPUImpl<float,_1,_0> *this,int parIndex,int childIndex,int probIndex,
          int firstDerivativeIndex,int categoryWeightsIndex,int stateFrequenciesIndex,
          int scalingFactorsIndex,double *outSumLogLikelihood,double *outSumFirstDerivative)

{
  uint uVar1;
  float fVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  float fVar10;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int i_3;
  int k_3;
  float *scalingFactors;
  int i_2;
  float sumOverID1;
  float sumOverI;
  int k_2;
  int u;
  int j;
  double sumOverJD1;
  double sumOverJ;
  int i_1;
  int w_1;
  int k_1;
  float weight_1;
  int u_2;
  int l_1;
  int v_1;
  float *partialsChild;
  int i;
  int w;
  int stateChild;
  int k;
  float weight;
  int u_1;
  int l;
  int v;
  int *statesChild;
  float *freqs;
  float *wt;
  float *firstDerivMatrix;
  float *transMatrix;
  float *partialsParent;
  int returnCode;
  undefined4 local_d0;
  undefined4 local_cc;
  undefined4 local_c0;
  undefined4 local_bc;
  undefined4 local_b8;
  undefined4 local_b4;
  undefined4 local_b0;
  undefined4 local_ac;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_84;
  undefined4 local_80;
  undefined4 local_7c;
  undefined4 local_70;
  undefined4 local_6c;
  undefined4 local_64;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_20;
  
  local_20 = 0;
  lVar4 = *(long *)(*(long *)(in_RDI + 0xa8) + (long)in_ESI * 8);
  lVar5 = *(long *)(*(long *)(in_RDI + 0xd0) + (long)in_ECX * 8);
  lVar6 = *(long *)(*(long *)(in_RDI + 0xd0) + (long)in_R8D * 8);
  lVar7 = *(long *)(*(long *)(in_RDI + 0x98) + (long)in_R9D * 8);
  lVar8 = *(long *)(*(long *)(in_RDI + 0xa0) + (long)i_3 * 8);
  memset(*(void **)(in_RDI + 0xd8),0,(long)(*(int *)(in_RDI + 0x14) * *(int *)(in_RDI + 0x24)) << 2)
  ;
  memset(*(void **)(in_RDI + 0xe0),0,(long)(*(int *)(in_RDI + 0x14) * *(int *)(in_RDI + 0x24)) << 2)
  ;
  if ((in_EDX < *(int *)(in_RDI + 0x10)) &&
     (*(long *)(*(long *)(in_RDI + 0xb0) + (long)in_EDX * 8) != 0)) {
    lVar9 = *(long *)(*(long *)(in_RDI + 0xb0) + (long)in_EDX * 8);
    local_54 = 0;
    for (local_58 = 0; local_58 < *(int *)(in_RDI + 0x34); local_58 = local_58 + 1) {
      local_5c = 0;
      uVar1 = *(uint *)(lVar7 + (long)local_58 * 4);
      for (local_64 = 0; local_64 < *(int *)(in_RDI + 0x14); local_64 = local_64 + 1) {
        iVar3 = *(int *)(lVar9 + (long)local_64 * 4);
        local_6c = local_58 * *(int *)(in_RDI + 0x40);
        for (local_70 = 0; local_70 < *(int *)(in_RDI + 0x24); local_70 = local_70 + 1) {
          auVar12 = vfmadd213ss_fma(ZEXT416(uVar1),
                                    ZEXT416((uint)(*(float *)(lVar5 + (long)(local_6c + iVar3) * 4)
                                                  * *(float *)(lVar4 + (long)(local_54 + local_70) *
                                                                       4))),
                                    ZEXT416(*(uint *)(*(long *)(in_RDI + 0xd8) + (long)local_5c * 4)
                                           ));
          *(int *)(*(long *)(in_RDI + 0xd8) + (long)local_5c * 4) = auVar12._0_4_;
          auVar12 = vfmadd213ss_fma(ZEXT416(uVar1),
                                    ZEXT416((uint)(*(float *)(lVar6 + (long)(local_6c + iVar3) * 4)
                                                  * *(float *)(lVar4 + (long)(local_54 + local_70) *
                                                                       4))),
                                    ZEXT416(*(uint *)(*(long *)(in_RDI + 0xe0) + (long)local_5c * 4)
                                           ));
          *(int *)(*(long *)(in_RDI + 0xe0) + (long)local_5c * 4) = auVar12._0_4_;
          local_5c = local_5c + 1;
          local_6c = *(int *)(in_RDI + 0x28) + local_6c;
        }
        local_54 = *(int *)(in_RDI + 0x2c) + local_54;
      }
    }
  }
  else {
    lVar9 = *(long *)(*(long *)(in_RDI + 0xa8) + (long)in_EDX * 8);
    local_7c = 0;
    for (local_80 = 0; local_80 < *(int *)(in_RDI + 0x34); local_80 = local_80 + 1) {
      local_84 = 0;
      fVar2 = *(float *)(lVar7 + (long)local_80 * 4);
      for (local_8c = 0; local_8c < *(int *)(in_RDI + 0x14); local_8c = local_8c + 1) {
        local_90 = local_80 * *(int *)(in_RDI + 0x40);
        for (local_94 = 0; local_94 < *(int *)(in_RDI + 0x24); local_94 = local_94 + 1) {
          local_a0 = 0.0;
          local_a8 = 0.0;
          for (local_ac = 0; local_ac < *(int *)(in_RDI + 0x24); local_ac = local_ac + 1) {
            local_a0 = (double)(*(float *)(lVar5 + (long)local_90 * 4) *
                               *(float *)(lVar9 + (long)(local_7c + local_ac) * 4)) + local_a0;
            fVar10 = *(float *)(lVar6 + (long)local_90 * 4) *
                     *(float *)(lVar9 + (long)(local_7c + local_ac) * 4);
            in_ZMM1 = ZEXT464((uint)fVar10);
            local_a8 = (double)fVar10 + local_a8;
            local_90 = local_90 + 1;
          }
          local_90 = local_90 + 1;
          auVar17._8_8_ = in_ZMM1._8_8_;
          auVar17._0_8_ = (double)fVar2;
          auVar21._0_8_ = (double)*(float *)(*(long *)(in_RDI + 0xd8) + (long)local_84 * 4);
          auVar21._8_8_ = 0;
          auVar12._8_8_ = 0;
          auVar12._0_8_ = local_a0 * (double)*(float *)(lVar4 + (long)(local_7c + local_94) * 4);
          auVar12 = vfmadd213sd_fma(auVar17,auVar12,auVar21);
          *(float *)(*(long *)(in_RDI + 0xd8) + (long)local_84 * 4) = (float)auVar12._0_8_;
          auVar18._0_8_ = (double)fVar2;
          auVar18._8_8_ = auVar12._8_8_;
          auVar22._0_8_ = (double)*(float *)(*(long *)(in_RDI + 0xe0) + (long)local_84 * 4);
          auVar22._8_8_ = 0;
          auVar13._8_8_ = 0;
          auVar13._0_8_ = local_a8 * (double)*(float *)(lVar4 + (long)(local_7c + local_94) * 4);
          auVar12 = vfmadd213sd_fma(auVar18,auVar13,auVar22);
          in_ZMM1 = ZEXT1664(auVar12);
          *(float *)(*(long *)(in_RDI + 0xe0) + (long)local_84 * 4) = (float)auVar12._0_8_;
          local_84 = local_84 + 1;
        }
        local_7c = *(int *)(in_RDI + 0x2c) + local_7c;
      }
    }
  }
  local_b0 = 0;
  for (local_b4 = 0; local_b4 < *(int *)(in_RDI + 0x14); local_b4 = local_b4 + 1) {
    local_b8 = 0.0;
    local_bc = 0.0;
    for (local_c0 = 0; local_c0 < *(int *)(in_RDI + 0x24); local_c0 = local_c0 + 1) {
      auVar12 = vfmadd213ss_fma(ZEXT416(*(uint *)(*(long *)(in_RDI + 0xd8) + (long)local_b0 * 4)),
                                ZEXT416(*(uint *)(lVar8 + (long)local_c0 * 4)),
                                ZEXT416((uint)local_b8));
      local_b8 = auVar12._0_4_;
      auVar12 = vfmadd213ss_fma(ZEXT416(*(uint *)(*(long *)(in_RDI + 0xe0) + (long)local_b0 * 4)),
                                ZEXT416(*(uint *)(lVar8 + (long)local_c0 * 4)),
                                ZEXT416((uint)local_bc));
      local_bc = auVar12._0_4_;
      local_b0 = local_b0 + 1;
    }
    dVar11 = log((double)local_b8);
    *(float *)(*(long *)(in_RDI + 0x108) + (long)local_b4 * 4) = (float)dVar11;
    *(float *)(*(long *)(in_RDI + 0x110) + (long)local_b4 * 4) = local_bc / local_b8;
  }
  if ((int)scalingFactors != -1) {
    lVar4 = *(long *)(*(long *)(in_RDI + 0xb8) + (long)(int)scalingFactors * 8);
    for (local_cc = 0; local_cc < *(int *)(in_RDI + 0x14); local_cc = local_cc + 1) {
      *(float *)(*(long *)(in_RDI + 0x108) + (long)local_cc * 4) =
           *(float *)(lVar4 + (long)local_cc * 4) +
           *(float *)(*(long *)(in_RDI + 0x108) + (long)local_cc * 4);
    }
  }
  *_i_2 = 0.0;
  auVar16 = ZEXT1664((undefined1  [16])0x0);
  *_sumOverI = 0;
  for (local_d0 = 0; local_d0 < *(int *)(in_RDI + 0x14); local_d0 = local_d0 + 1) {
    auVar19._0_8_ = (double)*(float *)(*(long *)(in_RDI + 0x108) + (long)local_d0 * 4);
    auVar19._8_8_ = auVar16._8_8_;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x78) + (long)local_d0 * 8);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = *_i_2;
    auVar12 = vfmadd213sd_fma(auVar14,auVar19,auVar23);
    *_i_2 = auVar12._0_8_;
    auVar20._0_8_ = (double)*(float *)(*(long *)(in_RDI + 0x110) + (long)local_d0 * 4);
    auVar20._8_8_ = auVar12._8_8_;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x78) + (long)local_d0 * 8);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = *_sumOverI;
    auVar12 = vfmadd213sd_fma(auVar15,auVar20,auVar24);
    auVar16 = ZEXT1664(auVar12);
    *_sumOverI = auVar12._0_8_;
  }
  if ((*_i_2 != *_i_2) || (NAN(*_i_2) || NAN(*_i_2))) {
    local_20 = -8;
  }
  return local_20;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsFirstDeriv(const int parIndex,
                                                               const int childIndex,
                                                               const int probIndex,
                                                               const int firstDerivativeIndex,
                                                               const int categoryWeightsIndex,
                                                               const int stateFrequenciesIndex,
                                                               const int scalingFactorsIndex,
                                                               double* outSumLogLikelihood,
                                                               double* outSumFirstDerivative) {

    assert(parIndex >= kTipCount);

    int returnCode = BEAGLE_SUCCESS;

    const REALTYPE* partialsParent = gPartials[parIndex];
    const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
    const REALTYPE* firstDerivMatrix = gTransitionMatrices[firstDerivativeIndex];
    const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];
    const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];


    memset(integrationTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));
    memset(firstDerivTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));

    if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

        const int* statesChild = gTipStates[childIndex];
        int v = 0; // Index for parent partials

        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0; // Index in resulting product-partials (summed over categories)
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {

                const int stateChild = statesChild[k];  // DISCUSSION PT: Does it make sense to change the order of the partials,
                // so we can interchange the patterCount and categoryCount loop order?
                int w =  l * kMatrixSize;
                for(int i = 0; i < kStateCount; i++) {
                    integrationTmp[u] += transMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    firstDerivTmp[u] += firstDerivMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    u++;

                    w += kTransPaddedStateCount;
                }
                v += kPartialsPaddedStateCount;
            }
        }

    } else { // Integrate against a partial at the child

        const REALTYPE* partialsChild = gPartials[childIndex];
        int v = 0;

        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0;
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {
                int w = l * kMatrixSize;
                for(int i = 0; i < kStateCount; i++) {
                    double sumOverJ = 0.0;
                    double sumOverJD1 = 0.0;
                    for(int j = 0; j < kStateCount; j++) {
                        sumOverJ += transMatrix[w] * partialsChild[v + j];
                        sumOverJD1 += firstDerivMatrix[w] * partialsChild[v + j];
                        w++;
                    }

                    // increment for the extra column at the end
                    w += T_PAD;

                    integrationTmp[u] += sumOverJ * partialsParent[v + i] * weight;
                    firstDerivTmp[u] += sumOverJD1 * partialsParent[v + i] * weight;
                    u++;
                }
                v += kPartialsPaddedStateCount;
            }
        }
    }

    int u = 0;
    for(int k = 0; k < kPatternCount; k++) {
        REALTYPE sumOverI = 0.0;
        REALTYPE sumOverID1 = 0.0;
        for(int i = 0; i < kStateCount; i++) {
            sumOverI += freqs[i] * integrationTmp[u];
            sumOverID1 += freqs[i] * firstDerivTmp[u];
            u++;
        }

        outLogLikelihoodsTmp[k] = log(sumOverI);
        outFirstDerivativesTmp[k] = sumOverID1 / sumOverI;
    }


    if (scalingFactorsIndex != BEAGLE_OP_NONE) {
        const REALTYPE* scalingFactors = gScaleBuffers[scalingFactorsIndex];
        for(int k=0; k < kPatternCount; k++)
            outLogLikelihoodsTmp[k] += scalingFactors[k];
    }

    *outSumLogLikelihood = 0.0;
    *outSumFirstDerivative = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];

        *outSumFirstDerivative += outFirstDerivativesTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;
}